

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_ui_pum_set_height(Nvim *this,Integer height)

{
  allocator local_39;
  string local_38;
  Integer local_18;
  Integer height_local;
  Nvim *this_local;
  
  local_18 = height;
  height_local = (Integer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_ui_pum_set_height",&local_39);
  NvimRPC::async_call<long>(&this->client_,&local_38,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::async_ui_pum_set_height(Integer height) {
    client_.async_call("nvim_ui_pum_set_height", height);
}